

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jint Java_beagle_BeagleJNIWrapper_transposeTransitionMatrices
               (JNIEnv *env,jobject param_2,jint instance,jintArray jInIndices,jintArray jOutIndices
               ,jint matrixCount)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  
  pjVar2 = (*env->functions->GetIntArrayElements)(env,jInIndices,(jboolean *)0x0);
  pjVar3 = (*env->functions->GetIntArrayElements)(env,jOutIndices,(jboolean *)0x0);
  jVar1 = beagleTransposeTransitionMatrices(instance,pjVar2,pjVar3,matrixCount);
  (*env->functions->ReleaseIntArrayElements)(env,jInIndices,pjVar2,2);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_transposeTransitionMatrices
        (JNIEnv *env, jobject, jint instance, jintArray jInIndices, jintArray jOutIndices, jint matrixCount) {

    jint errCode;

    jint *inIndices = env->GetIntArrayElements(jInIndices, NULL);
    jint *outIndices = env->GetIntArrayElements(jOutIndices, NULL);

    errCode = (jint)beagleTransposeTransitionMatrices(instance, (int *)inIndices, (int *)outIndices, matrixCount);

    env->ReleaseIntArrayElements(jInIndices, inIndices, JNI_ABORT);

    return errCode;
}